

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2,SorterRecord **ppOut)

{
  SorterRecord *pSVar1;
  int iVar2;
  SorterRecord *pKey2;
  anon_union_8_2_0134e7e8_for_u *paVar3;
  SorterRecord *pFinal;
  anon_union_8_2_0134e7e8_for_u local_30;
  
  paVar3 = &local_30;
  local_30.pNext = (SorterRecord *)0x0;
  pKey2 = p2 + 1;
  if (p2 == (SorterRecord *)0x0) {
    pKey2 = (SorterRecord *)0x0;
  }
  while( true ) {
    while( true ) {
      if ((p1 == (SorterRecord *)0x0) || (p2 == (SorterRecord *)0x0)) goto LAB_00133fc0;
      iVar2 = vdbeSorterCompare(pTask,p1 + 1,p1->nVal,pKey2,p2->nVal);
      if (0 < iVar2) break;
      paVar3->pNext = p1;
      paVar3 = &p1->u;
      pKey2 = (SorterRecord *)0x0;
      p1 = (p1->u).pNext;
    }
    paVar3->pNext = p2;
    pSVar1 = (p2->u).pNext;
    paVar3 = &p2->u;
    if (pSVar1 == (SorterRecord *)0x0) break;
    pKey2 = pSVar1 + 1;
    p2 = pSVar1;
  }
  p2 = (SorterRecord *)0x0;
LAB_00133fc0:
  if (p1 != (SorterRecord *)0x0) {
    p2 = p1;
  }
  paVar3->pNext = p2;
  *ppOut = (SorterRecord *)local_30;
  return;
}

Assistant:

static void vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2,               /* Second list to merge */
  SorterRecord **ppOut            /* OUT: Head of merged list */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  void *pVal2 = p2 ? SRVAL(p2) : 0;

  while( p1 && p2 ){
    int res;
    res = vdbeSorterCompare(pTask, SRVAL(p1), p1->nVal, pVal2, p2->nVal);
    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      pVal2 = 0;
    }else{
      *pp = p2;
       pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      if( p2==0 ) break;
      pVal2 = SRVAL(p2);
    }
  }
  *pp = p1 ? p1 : p2;
  *ppOut = pFinal;
}